

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O1

int nn_rep_create(void *hint,nn_sockbase **sockbase)

{
  nn_xrep *self;
  
  self = (nn_xrep *)nn_alloc_(0x1d8);
  if (self != (nn_xrep *)0x0) {
    nn_xrep_init(self,&nn_rep_sockbase_vfptr,hint);
    *(undefined4 *)&self[1].sockbase.vfptr = 0;
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_rep_create_cold_1();
}

Assistant:

static int nn_rep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_rep *self;

    self = nn_alloc (sizeof (struct nn_rep), "socket (rep)");
    alloc_assert (self);
    nn_rep_init (self, &nn_rep_sockbase_vfptr, hint);
    *sockbase = &self->xrep.sockbase;

    return 0;
}